

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::getp_scale(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  char *new_ext;
  
  uVar1 = *(ushort *)(this->super_CVmObject).ext_;
  if (getp_scale(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_scale(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar2 != 0) {
      getp_scale::desc.min_argc_ = 1;
      getp_scale::desc.opt_argc_ = 0;
      getp_scale::desc.varargs_ = 0;
      __cxa_guard_release(&getp_scale(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_scale::desc);
  if (iVar2 == 0) {
    iVar2 = CVmBif::pop_int_val();
    iVar3 = setup_getp_retval(this,self,retval,&new_ext,(ulong)uVar1);
    if (iVar3 == 0) {
      memcpy(new_ext,(this->super_CVmObject).ext_,(ulong)(uVar1 + 1 >> 1) + 5);
      *(short *)(new_ext + 2) = *(short *)(new_ext + 2) + (short)iVar2;
      sp_ = sp_ + -1;
    }
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_scale(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    int scale;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the scaling argument */
    scale = CVmBif::pop_int_val(vmg0_);

    /* set up the return value */
    if (setup_getp_retval(vmg_ self, retval, &new_ext, prec))
        return TRUE;
    
    /* copy the value */
    memcpy(new_ext, ext_, calc_alloc(prec));

    /* adjust the exponent by the scale factor */
    set_exp(new_ext, get_exp(new_ext) + scale);

    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}